

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O3

void FT_GlyphLoader_Rewind(FT_GlyphLoader loader)

{
  short sVar1;
  undefined4 uVar2;
  long lVar3;
  FT_GlyphLoadRec *pFVar4;
  FT_GlyphLoadRec *pFVar5;
  
  (loader->base).outline.n_contours = 0;
  (loader->base).outline.n_points = 0;
  (loader->base).num_subglyphs = 0;
  pFVar4 = &loader->base;
  pFVar5 = &loader->current;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    sVar1 = (pFVar4->outline).n_points;
    uVar2 = *(undefined4 *)&(pFVar4->outline).field_0x4;
    (pFVar5->outline).n_contours = (pFVar4->outline).n_contours;
    (pFVar5->outline).n_points = sVar1;
    *(undefined4 *)&(pFVar5->outline).field_0x4 = uVar2;
    pFVar4 = (FT_GlyphLoadRec *)&(pFVar4->outline).points;
    pFVar5 = (FT_GlyphLoadRec *)&(pFVar5->outline).points;
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_GlyphLoader_Rewind( FT_GlyphLoader  loader )
  {
    FT_GlyphLoad  base    = &loader->base;
    FT_GlyphLoad  current = &loader->current;


    base->outline.n_points   = 0;
    base->outline.n_contours = 0;
    base->num_subglyphs      = 0;

    *current = *base;
  }